

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O2

void decompress(char *buffer_out)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_44 = 0;
  local_3c = 0;
  local_38 = 0;
LAB_0010560b:
  if (local_3c == 2) {
    return;
  }
  iVar3 = (int)local_38;
  local_4c = iVar3 + local_3c * 4 + 4;
  local_38 = (ulong)*(uint *)(data + (long)iVar3 + (long)local_3c * 4);
  iVar6 = *(uint *)(data + (long)iVar3 + (long)local_3c * 4) + local_4c;
  iVar3 = local_44;
  local_3c = local_3c + 1;
LAB_00105637:
  iVar5 = local_4c + 1;
  bVar1 = data[local_4c];
  if (0xf < bVar1) {
    local_48 = (uint)(bVar1 >> 4);
    local_4c = iVar5;
    if (local_48 == 0xf) {
      pbVar4 = data + iVar5;
      local_48 = 0xf;
      do {
        bVar2 = *pbVar4;
        local_48 = local_48 + bVar2;
        pbVar4 = pbVar4 + 1;
        iVar5 = iVar5 + 1;
        local_4c = iVar5;
      } while (bVar2 == 0xff);
    }
    copyToDestination(buffer_out,&local_44,data,&local_4c,(int *)&local_48);
    iVar3 = local_44 + local_48;
    iVar5 = local_48 + local_4c;
    local_44 = iVar3;
    if (iVar6 <= iVar5) goto LAB_0010560b;
  }
  local_48 = iVar3 - (uint)*(ushort *)(data + iVar5);
  local_4c = iVar5 + 2;
  local_40 = (bVar1 & 0xf) + 4;
  if (local_40 == 0x13) {
    pbVar4 = data + local_4c;
    local_40 = 0x13;
    do {
      bVar1 = *pbVar4;
      local_40 = local_40 + (uint)bVar1;
      pbVar4 = pbVar4 + 1;
      local_4c = local_4c + 1;
    } while (bVar1 == 0xff);
  }
  if (*(ushort *)(data + iVar5) < 4) {
    lVar7 = (long)iVar3;
    for (lVar8 = 0; local_40 != (int)lVar8; lVar8 = lVar8 + 1) {
      lVar7 = lVar7 + 1;
      buffer_out[lVar8 + iVar3] = buffer_out[lVar8 + (int)local_48];
    }
    local_44 = (int)lVar7;
    iVar3 = iVar3 + (int)lVar8;
  }
  else {
    copyToDestination(buffer_out,&local_44,(uchar *)buffer_out,(int *)&local_48,&local_40);
    iVar3 = local_44 + local_40;
    local_44 = iVar3;
  }
  goto LAB_00105637;
}

Assistant:

void decompress(char* buffer_out) {
	int blockLength = 0;
    int p = 0;                                  //指向当前输出缓冲区的位置
	for(int i = 0; i < 2; i++) {
        int und_p = 4 * (i + 1) + blockLength;  //指向当前待解压区的位置
        blockLength = *((unsigned int*) (&data[4 * i + blockLength]));
		int und_end = und_p + blockLength;	    //待解压区的结束位置

		while (1) {
			int token = data[und_p++];

			//如果token中字面值长度是有的
			if (token >= 16) {
				int literalLength = token >> 4;    //字面值长度

				if (literalLength == 15) {
					//字面值长度大于等于15就接着去扩展区获取
					while (1) {
						int c = data[und_p++];
						literalLength += c;

						if (c != 255)
							break;
					}
				}

				//复制字面的字符
				copyToDestination(buffer_out, p, data, und_p, literalLength);

				//挪动当前位置指向和待压缩区位置指向
				p += literalLength;
				und_p += literalLength;

				//如果复制完字面字符已经到底了就退出
				if (und_p >= und_end)
					break;
			}

			//获取匹配字符串在的位置
			int ago_p = p - (*((unsigned short*)(&data[und_p])));
			und_p += 2;

			//获取token里的匹配长度
			int matchLength = (token & 15) + 4;

			if (matchLength == 15 + 4) {
				//如果有扩展长度就获取扩展的匹配长度
				while (1) {
					int c = data[und_p++];
					matchLength += c;

					if (c != 255)
						break;
				}
			}

			//偏移大于等于4可以大胆整块复制
			if (p - ago_p >= 4) {
				copyToDestination(buffer_out, p, (unsigned char*) buffer_out, ago_p, matchLength);
				p += matchLength;
			}
			else {
				//否则一个个字符复制
				while (matchLength-- != 0)
					buffer_out[p++] = buffer_out[ago_p++];
			}
		}
	}
}